

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer this_00;
  char *pcVar4;
  bool collapse;
  bool collapse_00;
  undefined1 local_2a8 [8];
  string cwd_1;
  string full;
  string cwd;
  string local_240;
  allocator<char> local_219;
  string local_218;
  char *local_1f8;
  char *existingValue;
  string local_1d0;
  undefined1 local_1b0 [8];
  string name_1;
  string fullPath_1;
  string local_150;
  string local_130;
  undefined1 local_110 [8];
  string name;
  string fullPath;
  string listFile;
  string cacheFile;
  string path;
  undefined1 local_58 [7];
  bool argIsFile;
  string cachePath;
  string listPath;
  string *arg_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cachePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  bVar1 = false;
  bVar2 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath((string *)((long)&cacheFile.field_2 + 8),arg);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&cacheFile.field_2 + 8));
    std::__cxx11::string::string
              ((string *)(listFile.field_2._M_local_buf + 8),
               (string *)(cacheFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(listFile.field_2._M_local_buf + 8),"/CMakeCache.txt");
    std::__cxx11::string::string
              ((string *)(fullPath.field_2._M_local_buf + 8),
               (string *)(cacheFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(fullPath.field_2._M_local_buf + 8),"/CMakeLists.txt");
    bVar2 = cmsys::SystemTools::FileExists((string *)((long)&listFile.field_2 + 8));
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_58,(string *)(cacheFile.field_2._M_local_buf + 8));
    }
    bVar2 = cmsys::SystemTools::FileExists((string *)((long)&fullPath.field_2 + 8));
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)(cachePath.field_2._M_local_buf + 8),
                 (string *)(cacheFile.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(listFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cacheFile.field_2._M_local_buf + 8));
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      bVar1 = true;
      cmsys::SystemTools::CollapseFullPath((string *)((long)&name.field_2 + 8),arg);
      cmsys::SystemTools::GetFilenameName((string *)local_110,(string *)((long)&name.field_2 + 8));
      cmsys::SystemTools::LowerCase(&local_130,(string *)local_110);
      std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"cmakecache.txt");
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_150,(string *)((long)&name.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_58,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_110,"cmakelists.txt");
        if (bVar2) {
          cmsys::SystemTools::GetFilenamePath
                    ((string *)((long)&fullPath_1.field_2 + 8),(string *)((long)&name.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(cachePath.field_2._M_local_buf + 8),
                     (string *)(fullPath_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fullPath_1.field_2._M_local_buf + 8));
        }
      }
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    }
    else {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&name_1.field_2 + 8),arg);
      cmsys::SystemTools::GetFilenameName((string *)local_1b0,(string *)((long)&name_1.field_2 + 8))
      ;
      cmsys::SystemTools::LowerCase(&local_1d0,(string *)local_1b0);
      std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b0,"cmakecache.txt");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"cmakelists.txt"), bVar2)) {
        bVar1 = true;
        cmsys::SystemTools::GetFilenamePath
                  ((string *)&existingValue,(string *)((long)&name_1.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),(string *)&existingValue);
        std::__cxx11::string::~string((string *)&existingValue);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),
                   (string *)(name_1.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (bVar2 = LoadCache(this,(string *)local_58), bVar2)) {
    this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"CMAKE_HOME_DIRECTORY",&local_219);
    pcVar4 = cmState::GetCacheEntryValue(this_00,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    local_1f8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      SetHomeOutputDirectory(this,(string *)local_58);
      pcVar4 = local_1f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar4,(allocator<char> *)(cwd.field_2._M_local_buf + 0xf));
      SetHomeDirectory(this,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)(cwd.field_2._M_local_buf + 0xf));
      cwd.field_2._8_4_ = 1;
      goto LAB_001f2bd4;
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    SetHomeDirectory(this,(string *)((long)&cachePath.field_2 + 8));
    if (bVar1) {
      SetHomeOutputDirectory(this,(string *)((long)&cachePath.field_2 + 8));
    }
    else {
      GetHomeOutputDirectory_abi_cxx11_(this);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)((long)&full.field_2 + 8),(SystemTools *)0x1,collapse);
        SetHomeOutputDirectory(this,(string *)((long)&full.field_2 + 8));
        std::__cxx11::string::~string((string *)(full.field_2._M_local_buf + 8));
      }
    }
    cwd.field_2._8_4_ = 1;
  }
  else {
    GetHomeDirectory_abi_cxx11_(this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&cwd_1.field_2 + 8),arg);
      SetHomeDirectory(this,(string *)((long)&cwd_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(cwd_1.field_2._M_local_buf + 8));
    }
    GetHomeOutputDirectory_abi_cxx11_(this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                ((string *)local_2a8,(SystemTools *)0x1,collapse_00);
      SetHomeOutputDirectory(this,(string *)local_2a8);
      std::__cxx11::string::~string((string *)local_2a8);
    }
    cwd.field_2._8_4_ = 0;
  }
LAB_001f2bd4:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(cachePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt") {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt") {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt" || name == "cmakelists.txt") {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      const char* existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
      }
    }
  }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    this->SetHomeDirectory(listPath);

    if (argIsFile) {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
    } else {
      // Source directory given on command line.  Use current working
      // directory as build tree if -B hasn't been given already
      if (this->GetHomeOutputDirectory().empty()) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    }
    return;
  }

  if (this->GetHomeDirectory().empty()) {
    // We didn't find a CMakeLists.txt and it wasn't specified
    // with -S. Assume it is the path to the source tree
    std::string full = cmSystemTools::CollapseFullPath(arg);
    this->SetHomeDirectory(full);
  }
  if (this->GetHomeOutputDirectory().empty()) {
    // We didn't find a CMakeCache.txt and it wasn't specified
    // with -B. Assume the current working directory as the build tree.
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    this->SetHomeOutputDirectory(cwd);
  }
}